

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O1

bool libwebm::vttdemux::WriteCue(FILE *f,BlockGroup *block_group)

{
  bool bVar1;
  int iVar2;
  FrameParser parser;
  FrameParser FStack_28;
  
  FrameParser::FrameParser(&FStack_28,block_group);
  iVar2 = fputc(10,(FILE *)f);
  if (-1 < iVar2) {
    bVar1 = WriteCueIdentifier(f,&FStack_28);
    if (bVar1) {
      bVar1 = WriteCueTimings(f,&FStack_28);
      if (bVar1) {
        bVar1 = WriteCuePayload(f,&FStack_28);
        goto LAB_0010d05d;
      }
    }
  }
  bVar1 = false;
LAB_0010d05d:
  libwebvtt::Parser::~Parser((Parser *)&FStack_28);
  return bVar1;
}

Assistant:

bool vttdemux::WriteCue(FILE* f, const mkvparser::BlockGroup* block_group) {
  // Bind a FrameParser object to the block, which allows us to
  // extract each line of text from the payload of the block.
  FrameParser parser(block_group);

  // We start a new cue by writing a cue separator (an empty line)
  // into the stream.

  if (fputc('\n', f) < 0)
    return false;

  // A WebVTT Cue comprises 3 things: a cue identifier, followed by
  // the cue timings, followed by the payload of the cue.  We write
  // each part of the cue in sequence.

  if (!WriteCueIdentifier(f, &parser))
    return false;

  if (!WriteCueTimings(f, &parser))
    return false;

  if (!WriteCuePayload(f, &parser))
    return false;

  return true;
}